

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

double __thiscall r_exec::Group::update_sln(Group *this,View *v)

{
  uint16_t uVar1;
  uint uVar2;
  _Mem *p_Var3;
  View *pVVar4;
  Group *pGVar5;
  Code *pCVar6;
  _Mem *p_Var7;
  Code *pCVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  float local_9c;
  float local_5c;
  ushort local_38;
  uint16_t i_1;
  uint16_t ntf_grp_count_1;
  ushort local_24;
  uint16_t i;
  uint16_t ntf_grp_count;
  double sln;
  View *v_local;
  Group *this_local;
  
  if ((0 < this->decay_periods_to_go) && ((this->sln_decay != 0.0 || (NAN(this->sln_decay))))) {
    fVar9 = View::get_sln(v);
    View::mod_sln(v,(double)fVar9 * this->sln_decay);
  }
  fVar9 = get_low_sln_thr(this);
  fVar10 = get_high_sln_thr(this);
  dVar11 = View::update_sln(v,(double)fVar9,(double)fVar10);
  this->avg_sln = dVar11 + this->avg_sln;
  if (dVar11 < this->high_sln || dVar11 == this->high_sln) {
    if (dVar11 < this->low_sln) {
      this->low_sln = dVar11;
    }
  }
  else {
    this->high_sln = dVar11;
  }
  this->sln_updates = this->sln_updates + 1;
  uVar2 = (*(v->super_View).super__Object._vptr__Object[2])();
  if ((uVar2 & 1) == 0) {
    local_5c = (float)v->periods_at_high_sln;
    fVar9 = get_sln_ntf_prd(this);
    if ((local_5c != fVar9) || (NAN(local_5c) || NAN(fVar9))) {
      local_9c = (float)v->periods_at_low_sln;
      fVar9 = get_sln_ntf_prd(this);
      if ((local_9c == fVar9) && (!NAN(local_9c) && !NAN(fVar9))) {
        v->periods_at_low_sln = 0;
        uVar1 = get_ntf_grp_count(this);
        for (local_38 = 1; local_38 <= uVar1; local_38 = local_38 + 1) {
          p_Var3 = _Mem::Get();
          pVVar4 = (View *)operator_new(0x100);
          pGVar5 = get_ntf_grp(this,local_38);
          pCVar6 = (Code *)operator_new(0x150);
          p_Var7 = _Mem::Get();
          pCVar8 = core::P::operator_cast_to_Code_((P *)&(v->super_View).object);
          MkLowSln::MkLowSln((MkLowSln *)pCVar6,&p_Var7->super_Mem,pCVar8);
          NotificationView::NotificationView
                    ((NotificationView *)pVVar4,(Code *)this,(Code *)pGVar5,pCVar6);
          _Mem::inject_notification(p_Var3,pVVar4,false);
        }
      }
    }
    else {
      v->periods_at_high_sln = 0;
      uVar1 = get_ntf_grp_count(this);
      for (local_24 = 1; local_24 <= uVar1; local_24 = local_24 + 1) {
        p_Var3 = _Mem::Get();
        pVVar4 = (View *)operator_new(0x100);
        pGVar5 = get_ntf_grp(this,local_24);
        pCVar6 = (Code *)operator_new(0x150);
        p_Var7 = _Mem::Get();
        pCVar8 = core::P::operator_cast_to_Code_((P *)&(v->super_View).object);
        MkHighSln::MkHighSln((MkHighSln *)pCVar6,&p_Var7->super_Mem,pCVar8);
        NotificationView::NotificationView
                  ((NotificationView *)pVVar4,(Code *)this,(Code *)pGVar5,pCVar6);
        _Mem::inject_notification(p_Var3,pVVar4,false);
      }
    }
  }
  return dVar11;
}

Assistant:

double Group::update_sln(View *v)
{
    if (decay_periods_to_go > 0 && sln_decay != 0) {
        v->mod_sln(v->get_sln()*sln_decay);
    }

    double sln = v->update_sln(get_low_sln_thr(), get_high_sln_thr());
    avg_sln += sln;

    if (sln > high_sln) {
        high_sln = sln;
    } else if (sln < low_sln) {
        low_sln = sln;
    }

    ++sln_updates;

    if (!v->isNotification()) {
        if (v->periods_at_high_sln == get_sln_ntf_prd()) {
            v->periods_at_high_sln = 0;
            uint16_t ntf_grp_count = get_ntf_grp_count();

            for (uint16_t i = 1; i <= ntf_grp_count; ++i) {
                _Mem::Get()->inject_notification(new NotificationView(this, get_ntf_grp(i), new MkHighSln(_Mem::Get(), v->object)), false);
            }
        } else if (v->periods_at_low_sln == get_sln_ntf_prd()) {
            v->periods_at_low_sln = 0;
            uint16_t ntf_grp_count = get_ntf_grp_count();

            for (uint16_t i = 1; i <= ntf_grp_count; ++i) {
                _Mem::Get()->inject_notification(new NotificationView(this, get_ntf_grp(i), new MkLowSln(_Mem::Get(), v->object)), false);
            }
        }
    }

    return sln;
}